

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_utils.c
# Opt level: O0

char * apprun_shell_resolve_var_value(char **argv,char *var_name)

{
  int iVar1;
  ushort **ppuVar2;
  long lVar3;
  long idx;
  char *var_value;
  uint argc;
  char *var_name_local;
  char **argv_local;
  
  var_value._4_4_ = 0;
  if (argv != (char **)0x0) {
    var_value._4_4_ = apprun_string_list_len(argv);
  }
  idx = 0;
  ppuVar2 = __ctype_b_loc();
  if ((((*ppuVar2)[(int)*var_name] & 0x800) != 0) &&
     (lVar3 = atol(var_name), lVar3 <= (long)(ulong)var_value._4_4_)) {
    idx = (long)strdup(argv[lVar3]);
  }
  iVar1 = strcmp(var_name,"@");
  if ((iVar1 == 0) && (argv != (char **)0x0)) {
    idx = (long)apprun_argv_to_env(argv + 1);
  }
  ppuVar2 = __ctype_b_loc();
  if ((((*ppuVar2)[(int)*var_name] & 0x400) != 0) &&
     (idx = (long)getenv(var_name), (char *)idx != (char *)0x0)) {
    idx = (long)strdup((char *)idx);
  }
  return (char *)idx;
}

Assistant:

char *apprun_shell_resolve_var_value(char *const *argv, const char *var_name) {
    unsigned argc = 0;
    if (argv)
        argc = apprun_string_list_len(argv);

    char *var_value = NULL;
    if (isdigit(*var_name)) {
        long idx = atol(var_name);
        if (idx <= argc)
            var_value = strdup(argv[idx]);
    }

    if (strcmp(var_name, "@") == 0 && argv != NULL)
        var_value = apprun_argv_to_env(argv + 1);

    if (isalpha(*var_name)) {
        var_value = getenv(var_name);
        if (var_value)
            var_value = strdup(var_value);
    }


    return var_value;
}